

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

VariableID __thiscall spirv_cross::Compiler::build_dummy_sampler_for_combined_images(Compiler *this)

{
  uint32_t id;
  SPIRFunction *func;
  allocator local_1e9;
  string local_1e8 [36];
  ID local_1c4;
  int local_1c0 [2];
  TypedID<(spirv_cross::Types)1> local_1b8;
  TypedID<(spirv_cross::Types)0> local_1b4;
  SPIRType *local_1b0;
  SPIRType *ptr_sampler;
  SPIRType *sampler;
  SPIRType sampler_type;
  uint32_t local_48;
  uint32_t var_id;
  uint32_t ptr_type_id;
  uint32_t type_id;
  uint32_t offset;
  undefined1 local_30 [8];
  DummySamplerForCombinedImageHandler handler;
  Compiler *this_local;
  
  handler._16_8_ = this;
  DummySamplerForCombinedImageHandler::DummySamplerForCombinedImageHandler
            ((DummySamplerForCombinedImageHandler *)local_30,this);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  func = get<spirv_cross::SPIRFunction>(this,id);
  traverse_all_reachable_opcodes(this,func,(OpcodeHandler *)local_30);
  if (((byte)handler.compiler & 1) == 0) {
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&this_local + 4),0);
  }
  else {
    var_id = ParsedIR::increase_bound_by(&this->ir,3);
    local_48 = var_id + 1;
    sampler_type.member_name_cache._M_h._M_single_bucket._4_4_ = var_id + 2;
    ptr_type_id = var_id;
    SPIRType::SPIRType((SPIRType *)&sampler);
    ptr_sampler = set<spirv_cross::SPIRType>(this,var_id);
    *(undefined4 *)&(ptr_sampler->super_IVariant).field_0xc = 0x12;
    local_1b0 = set<spirv_cross::SPIRType>(this,local_48);
    SPIRType::operator=(local_1b0,ptr_sampler);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_1b4,var_id);
    (local_1b0->super_IVariant).self.id = local_1b4.id;
    local_1b0->storage = StorageClassUniformConstant;
    local_1b0->pointer = true;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_1b8,var_id);
    (local_1b0->parent_type).id = local_1b8.id;
    local_1c0[1] = 0;
    local_1c0[0] = 0;
    set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
              (this,sampler_type.member_name_cache._M_h._M_single_bucket._4_4_,&local_48,
               (StorageClass *)(local_1c0 + 1),local_1c0);
    TypedID<(spirv_cross::Types)0>::TypedID
              (&local_1c4,sampler_type.member_name_cache._M_h._M_single_bucket._4_4_);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1e8,"SPIRV_Cross_DummySampler",&local_1e9);
    set_name(this,local_1c4,(string *)local_1e8);
    ::std::__cxx11::string::~string(local_1e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    this->dummy_sampler_id = sampler_type.member_name_cache._M_h._M_single_bucket._4_4_;
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&this_local + 4),
               sampler_type.member_name_cache._M_h._M_single_bucket._4_4_);
    SPIRType::~SPIRType((SPIRType *)&sampler);
  }
  DummySamplerForCombinedImageHandler::~DummySamplerForCombinedImageHandler
            ((DummySamplerForCombinedImageHandler *)local_30);
  return (VariableID)this_local._4_4_;
}

Assistant:

VariableID Compiler::build_dummy_sampler_for_combined_images()
{
	DummySamplerForCombinedImageHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	if (handler.need_dummy_sampler)
	{
		uint32_t offset = ir.increase_bound_by(3);
		auto type_id = offset + 0;
		auto ptr_type_id = offset + 1;
		auto var_id = offset + 2;

		SPIRType sampler_type;
		auto &sampler = set<SPIRType>(type_id);
		sampler.basetype = SPIRType::Sampler;

		auto &ptr_sampler = set<SPIRType>(ptr_type_id);
		ptr_sampler = sampler;
		ptr_sampler.self = type_id;
		ptr_sampler.storage = StorageClassUniformConstant;
		ptr_sampler.pointer = true;
		ptr_sampler.parent_type = type_id;

		set<SPIRVariable>(var_id, ptr_type_id, StorageClassUniformConstant, 0);
		set_name(var_id, "SPIRV_Cross_DummySampler");
		dummy_sampler_id = var_id;
		return var_id;
	}
	else
		return 0;
}